

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O2

void __thiscall
duckdb::InMemoryLogStorageScanState::InMemoryLogStorageScanState(InMemoryLogStorageScanState *this)

{
  (this->super_LogStorageScanState)._vptr_LogStorageScanState =
       (_func_int **)&PTR__InMemoryLogStorageScanState_027b49e8;
  (this->scan_state).current_chunk_state.handles._M_h._M_buckets =
       &(this->scan_state).current_chunk_state.handles._M_h._M_single_bucket;
  (this->scan_state).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->scan_state).current_chunk_state.handles._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->scan_state).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->scan_state).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->scan_state).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  (this->scan_state).current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->scan_state).current_chunk_state.properties = INVALID;
  (this->scan_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->scan_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->scan_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

InMemoryLogStorageScanState::InMemoryLogStorageScanState() {
}